

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UResourceDataEntry * getPoolEntry(char *path,UErrorCode *status)

{
  UBool UVar1;
  UResourceDataEntry *pUVar2;
  UResourceDataEntry *poolBundle;
  UErrorCode *status_local;
  char *path_local;
  
  pUVar2 = init_entry("pool",path,status);
  UVar1 = U_SUCCESS(*status);
  if ((UVar1 != '\0') &&
     (((pUVar2 == (UResourceDataEntry *)0x0 || (pUVar2->fBogus != U_ZERO_ERROR)) ||
      ((pUVar2->fData).isPoolBundle == '\0')))) {
    *status = U_INVALID_FORMAT_ERROR;
  }
  return pUVar2;
}

Assistant:

static UResourceDataEntry *
getPoolEntry(const char *path, UErrorCode *status) {
    UResourceDataEntry *poolBundle = init_entry(kPoolBundleName, path, status);
    if( U_SUCCESS(*status) &&
        (poolBundle == NULL || poolBundle->fBogus != U_ZERO_ERROR || !poolBundle->fData.isPoolBundle)
    ) {
        *status = U_INVALID_FORMAT_ERROR;
    }
    return poolBundle;
}